

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O0

ostream * fizplex::operator<<(ostream *os,Column *c)

{
  initializer_list<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  int iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  long in_RSI;
  ostream *in_RDI;
  key_type *in_stack_fffffffffffffe88;
  unordered_map<fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::ColType>,_std::equal_to<fizplex::ColType>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe90;
  key_equal *in_stack_fffffffffffffe98;
  hasher *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  unordered_map<fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::ColType>,_std::equal_to<fizplex::ColType>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffeb0;
  iterator in_stack_fffffffffffffeb8;
  pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffed0;
  undefined1 ***pppuVar4;
  undefined8 **local_128;
  undefined1 local_117 [7];
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_f4;
  undefined1 **local_f0;
  undefined8 *local_e8 [5];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  undefined1 **local_20;
  undefined8 local_18;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,fizplex::LP::Column_const&)::
                                 ctos_abi_cxx11_);
    if (iVar1 != 0) {
      local_f0 = (undefined1 **)local_e8;
      local_f4 = 0;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[6],_true>
                (in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->first,
                 (char (*) [6])in_stack_fffffffffffffeb0);
      local_f0 = (undefined1 **)local_c0;
      local_108 = 1;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[8],_true>
                (in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->first,
                 (char (*) [8])in_stack_fffffffffffffeb0);
      local_f0 = (undefined1 **)local_98;
      local_10c = 2;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[11],_true>
                (in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->first,
                 (char (*) [11])in_stack_fffffffffffffeb0);
      local_f0 = (undefined1 **)local_70;
      local_110 = 3;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[5],_true>
                (in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->first,
                 (char (*) [5])in_stack_fffffffffffffeb0);
      local_f0 = (undefined1 **)local_48;
      local_117._3_4_ = 4;
      std::
      pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::ColType,_const_char_(&)[11],_true>
                (in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->first,
                 (char (*) [11])in_stack_fffffffffffffeb0);
      local_20 = (undefined1 **)local_e8;
      local_18 = 5;
      in_stack_fffffffffffffe88 = (key_type *)local_117;
      std::
      allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator((allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x12bd51);
      __l._M_len = (size_type)in_stack_fffffffffffffec0;
      __l._M_array = in_stack_fffffffffffffeb8;
      std::
      unordered_map<fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::ColType>,_std::equal_to<fizplex::ColType>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map(in_stack_fffffffffffffeb0,__l,in_stack_fffffffffffffea8,
                      in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffed0)
      ;
      std::
      allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator((allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x12bd92);
      pppuVar4 = (undefined1 ***)local_e8;
      local_128 = &local_20;
      do {
        local_128 = local_128 + -5;
        std::
        pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x12bdbd);
      } while ((undefined1 ***)local_128 != pppuVar4);
      __cxa_atexit(std::
                   unordered_map<fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::ColType>,_std::equal_to<fizplex::ColType>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,fizplex::LP::Column_const&)::ctos_abi_cxx11_);
    }
  }
  poVar3 = local_8;
  pmVar2 = std::
           unordered_map<fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::ColType>,_std::equal_to<fizplex::ColType>,_std::allocator<std::pair<const_fizplex::ColType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  poVar3 = std::operator<<(poVar3,(string *)pmVar2);
  poVar3 = std::operator<<(poVar3,": ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(local_10 + 8));
  poVar3 = std::operator<<(poVar3," <= x <= ");
  std::ostream::operator<<(poVar3,*(double *)(local_10 + 0x10));
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const LP::Column &c) {
  static std::unordered_map<ColType, std::string> ctos = {
      {ColType::Fixed, "Fixed"},
      {ColType::Bounded, "Bounded"},
      {ColType::LowerBound, "LowerBound"},
      {ColType::Free, "Free"},
      {ColType::UpperBound, "UpperBound"}};
  os << ctos[c.type] << ": " << c.lower << " <= x <= " << c.upper;
  return os;
}